

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O0

void divsufsortxx::substring::
     merge<std::stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>>,char*,bitmap::BitmapArray<long>::iterator,long*>
               (stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                *stack,char *T,iterator PA,iterator first,iterator middle,iterator last,long *buf,
               value_type bufsize,value_type depth)

{
  iterator c;
  iterator first2;
  iterator last1;
  iterator first1;
  iterator p2;
  iterator p2_00;
  iterator p2_01;
  iterator p2_02;
  iterator p2_03;
  iterator p2_04;
  iterator p2_05;
  iterator p2_06;
  iterator p1;
  iterator p1_00;
  iterator p1_01;
  iterator p1_02;
  iterator p1_03;
  iterator p1_04;
  iterator p1_05;
  iterator p1_06;
  iterator last_00;
  iterator a;
  iterator a_00;
  iterator middle_00;
  iterator last_01;
  iterator c_00;
  BitmapArray<long> *pBVar1;
  pos_type pVar2;
  bool bVar3;
  int iVar4;
  difference_type dVar5;
  long lVar6;
  reference pvVar7;
  ulong uVar8;
  ulong *puVar9;
  iterator *it;
  difference_type dVar10;
  undefined8 in_RCX;
  undefined8 in_RDX;
  BitmapArray<long> *in_RSI;
  BitmapArray<long> *in_R8;
  pos_type in_R9;
  iterator iVar11;
  reference rVar12;
  value_type *in_stack_00000008;
  value_reference *in_stack_00000010;
  value_type *in_stack_00000018;
  value_reference *in_stack_00000020;
  long in_stack_00000030;
  BitmapArray<long> *in_stack_00000038;
  stackinfo_type tempinfo_2;
  stackinfo_type tempinfo_1;
  stackinfo_type tempinfo;
  int next;
  int check;
  difference_type half;
  difference_type len;
  difference_type m;
  iterator j;
  iterator i;
  value_type *in_stack_fffffffffffff4a8;
  value_reference *in_stack_fffffffffffff4b0;
  value_type *in_stack_fffffffffffff4b8;
  BitmapArray<long> *in_stack_fffffffffffff4c8;
  pos_type in_stack_fffffffffffff4d0;
  BitmapArray<long> *in_stack_fffffffffffff4d8;
  pos_type in_stack_fffffffffffff4e0;
  BitmapArray<long> *in_stack_fffffffffffff4e8;
  undefined7 in_stack_fffffffffffff4f0;
  undefined1 in_stack_fffffffffffff4f7;
  ulong in_stack_fffffffffffff558;
  char *in_stack_fffffffffffff560;
  BitmapArray<long> *in_stack_fffffffffffff568;
  ulong in_stack_fffffffffffff570;
  BitmapArray<long> *in_stack_fffffffffffff578;
  BitmapArray<long> *in_stack_fffffffffffff580;
  iterator local_a00;
  iterator iStack_9f0;
  iterator iStack_9e0;
  uint local_9d0;
  reference local_9c8;
  reference local_9b8;
  reference local_9a8;
  iterator local_998;
  iterator local_988;
  reference local_978;
  iterator local_968;
  reference local_958;
  iterator local_948;
  reference local_938;
  iterator local_928;
  reference local_918;
  reference local_908;
  reference local_8f8;
  reference local_8e8;
  iterator local_8d8;
  iterator local_8c8;
  reference in_stack_fffffffffffff748;
  iterator in_stack_fffffffffffff758;
  reference in_stack_fffffffffffff768;
  BitmapArray<long> *in_stack_fffffffffffff780;
  BitmapArray<long> *in_stack_fffffffffffff788;
  BitmapArray<long> *in_stack_fffffffffffff790;
  BitmapArray<long> *in_stack_fffffffffffff798;
  pos_type in_stack_fffffffffffff7a0;
  stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>
  local_758;
  iterator local_710;
  BitmapArray<long> *local_700;
  pos_type local_6f8;
  stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>
  local_6f0;
  reference local_6b8;
  iterator local_6a8;
  reference local_698;
  iterator local_688;
  reference local_678;
  iterator local_668;
  reference local_658;
  iterator local_648;
  reference local_638;
  iterator local_628 [3];
  iterator local_5f8;
  iterator in_stack_fffffffffffffa18;
  iterator in_stack_fffffffffffffa28;
  iterator in_stack_fffffffffffffa38;
  BitmapArray<long> *in_stack_fffffffffffffa50;
  BitmapArray<long> *in_stack_fffffffffffffa58;
  BitmapArray<long> *in_stack_fffffffffffffa60;
  BitmapArray<long> *in_stack_fffffffffffffa68;
  pos_type in_stack_fffffffffffffa70;
  difference_type local_478;
  difference_type local_470;
  iterator local_468;
  iterator iStack_458;
  iterator iStack_448;
  uint local_438;
  reference local_430;
  reference local_420;
  reference local_410;
  iterator local_400;
  iterator local_3f0;
  reference local_3e0;
  iterator local_3d0;
  reference local_3c0;
  iterator local_3b0;
  reference local_3a0;
  iterator local_390;
  reference local_380;
  reference local_370;
  reference local_360;
  reference local_350;
  iterator local_340;
  iterator local_330;
  reference local_320;
  iterator local_310;
  reference local_300;
  iterator local_2f0;
  reference local_2e0;
  iterator local_2d0;
  reference local_2c0;
  BitmapArray<long> *local_290;
  pos_type local_288;
  undefined8 local_280;
  undefined8 local_278;
  iterator local_270;
  iterator iStack_260;
  iterator iStack_250;
  uint local_240;
  reference local_238;
  reference local_228;
  reference local_218;
  iterator local_208;
  iterator local_1f8;
  reference local_1e8;
  iterator local_1d8;
  reference local_1c8;
  iterator local_1b8;
  reference local_1a8;
  iterator local_198;
  reference local_188;
  reference local_178;
  reference local_168;
  reference local_158;
  iterator local_148;
  iterator local_138;
  reference local_128;
  iterator local_118;
  reference local_108;
  iterator local_f8;
  reference local_e8;
  iterator local_d8;
  reference local_c8;
  BitmapArray<long> *local_98;
  pos_type local_90;
  undefined8 local_88;
  undefined8 local_80;
  uint local_78;
  uint local_74;
  ulong local_70;
  ulong local_68;
  long local_60;
  iterator local_58;
  iterator local_48;
  BitmapArray<long> *local_38;
  iterator local_28;
  undefined8 local_18;
  undefined8 local_10;
  
  local_38 = in_RSI;
  local_28.array_ = in_R8;
  local_28.pos_ = in_R9;
  local_18 = in_RDX;
  local_10 = in_RCX;
  bitmap::BitmapArray<long>::iterator::iterator(&local_48);
  bitmap::BitmapArray<long>::iterator::iterator(&local_58);
  local_74 = 0;
  while( true ) {
    while (dVar5 = bitmap::BitmapArray<long>::iterator::operator-
                             ((iterator *)&stack0x00000018,(iterator *)&stack0x00000008),
          in_stack_00000030 < dVar5) {
      dVar5 = bitmap::BitmapArray<long>::iterator::operator-((iterator *)&stack0x00000008,&local_28)
      ;
      if (in_stack_00000030 < dVar5) {
        local_60 = 0;
        local_470 = bitmap::BitmapArray<long>::iterator::operator-
                              ((iterator *)&stack0x00000008,&local_28);
        local_478 = bitmap::BitmapArray<long>::iterator::operator-
                              ((iterator *)&stack0x00000018,(iterator *)&stack0x00000008);
        puVar9 = (ulong *)std::min<long>(&local_470,&local_478);
        local_68 = *puVar9;
        while (local_70 = (long)local_68 >> 1, 0 < (long)local_68) {
          in_stack_fffffffffffff568 = local_38;
          bitmap::BitmapArray<long>::iterator::operator+
                    (&in_stack_fffffffffffff4b8->m_a,(difference_type)in_stack_fffffffffffff4b0);
          bitmap::BitmapArray<long>::iterator::operator+
                    (&in_stack_fffffffffffff4b8->m_a,(difference_type)in_stack_fffffffffffff4b0);
          bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x120689);
          lVar6 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                            ((value_reference *)0x1206a6);
          if (lVar6 < 0) {
            bitmap::BitmapArray<long>::iterator::operator+
                      (&in_stack_fffffffffffff4b8->m_a,(difference_type)in_stack_fffffffffffff4b0);
            bitmap::BitmapArray<long>::iterator::operator+
                      (&in_stack_fffffffffffff4b8->m_a,(difference_type)in_stack_fffffffffffff4b0);
            bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x12078c);
            uVar8 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                              ((value_reference *)0x1207a9);
            in_stack_fffffffffffff560 = (char *)(uVar8 ^ 0xffffffffffffffff);
          }
          else {
            bitmap::BitmapArray<long>::iterator::operator+
                      (&in_stack_fffffffffffff4b8->m_a,(difference_type)in_stack_fffffffffffff4b0);
            bitmap::BitmapArray<long>::iterator::operator+
                      (&in_stack_fffffffffffff4b8->m_a,(difference_type)in_stack_fffffffffffff4b0);
            bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x12070b);
            in_stack_fffffffffffff560 =
                 (char *)bitmap::BitmapArray::value_reference::operator_cast_to_long
                                   ((value_reference *)0x120728);
          }
          bitmap::BitmapArray<long>::iterator::operator+
                    (&in_stack_fffffffffffff4b8->m_a,(difference_type)in_stack_fffffffffffff4b0);
          bitmap::BitmapArray<long>::iterator::operator-
                    (&in_stack_fffffffffffff4b8->m_a,(difference_type)in_stack_fffffffffffff4b0);
          bitmap::BitmapArray<long>::iterator::operator-
                    (&in_stack_fffffffffffff4b8->m_a,(difference_type)in_stack_fffffffffffff4b0);
          bitmap::BitmapArray<long>::iterator::operator-
                    (&in_stack_fffffffffffff4b8->m_a,(difference_type)in_stack_fffffffffffff4b0);
          bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x120853);
          lVar6 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                            ((value_reference *)0x120870);
          if (lVar6 < 0) {
            in_stack_fffffffffffffa18 =
                 bitmap::BitmapArray<long>::iterator::operator-
                           (&in_stack_fffffffffffff4b8->m_a,
                            (difference_type)in_stack_fffffffffffff4b0);
            in_stack_fffffffffffffa28 =
                 bitmap::BitmapArray<long>::iterator::operator-
                           (&in_stack_fffffffffffff4b8->m_a,
                            (difference_type)in_stack_fffffffffffff4b0);
            in_stack_fffffffffffffa38 =
                 bitmap::BitmapArray<long>::iterator::operator-
                           (&in_stack_fffffffffffff4b8->m_a,
                            (difference_type)in_stack_fffffffffffff4b0);
            rVar12 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x12099a);
            in_stack_fffffffffffffa50 = (BitmapArray<long> *)rVar12.pos_;
            in_stack_fffffffffffff558 =
                 bitmap::BitmapArray::value_reference::operator_cast_to_long
                           ((value_reference *)0x1209b7);
            in_stack_fffffffffffff558 = in_stack_fffffffffffff558 ^ 0xffffffffffffffff;
          }
          else {
            iVar11 = bitmap::BitmapArray<long>::iterator::operator-
                               (&in_stack_fffffffffffff4b8->m_a,
                                (difference_type)in_stack_fffffffffffff4b0);
            in_stack_fffffffffffffa58 = iVar11.array_;
            in_stack_fffffffffffffa60 = (BitmapArray<long> *)iVar11.pos_;
            iVar11 = bitmap::BitmapArray<long>::iterator::operator-
                               (&in_stack_fffffffffffff4b8->m_a,
                                (difference_type)in_stack_fffffffffffff4b0);
            in_stack_fffffffffffffa68 = iVar11.array_;
            in_stack_fffffffffffffa70 = iVar11.pos_;
            bitmap::BitmapArray<long>::iterator::operator-
                      (&in_stack_fffffffffffff4b8->m_a,(difference_type)in_stack_fffffffffffff4b0);
            bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x1208f7);
            in_stack_fffffffffffff558 =
                 bitmap::BitmapArray::value_reference::operator_cast_to_long
                           ((value_reference *)0x120914);
          }
          bitmap::BitmapArray<long>::iterator::operator+
                    (&in_stack_fffffffffffff4b8->m_a,(difference_type)in_stack_fffffffffffff4b0);
          p1_03.pos_ = (pos_type)in_stack_fffffffffffff580;
          p1_03.array_ = in_stack_fffffffffffff578;
          p2_03.pos_ = in_stack_fffffffffffff570;
          p2_03.array_ = in_stack_fffffffffffff568;
          iVar4 = compare<char*,bitmap::BitmapArray<long>::iterator>
                            (in_stack_fffffffffffff560,p1_03,p2_03,in_stack_fffffffffffff558);
          if (iVar4 < 0) {
            local_60 = local_70 + 1 + local_60;
            local_70 = local_70 - ((local_68 & 1) == 0);
          }
          local_68 = local_70;
        }
        if (local_60 < 1) {
          if ((local_74 & 1) != 0) {
            bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x121086);
            lVar6 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                              ((value_reference *)0x1210a3);
            bVar3 = false;
            if (-1 < lVar6) {
              bitmap::BitmapArray<long>::iterator::operator-
                        (&in_stack_fffffffffffff4b8->m_a,(difference_type)in_stack_fffffffffffff4b0)
              ;
              bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x1210f9);
              lVar6 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                                ((value_reference *)0x121116);
              if (lVar6 < 0) {
                bitmap::BitmapArray<long>::iterator::operator-
                          (&in_stack_fffffffffffff4b8->m_a,
                           (difference_type)in_stack_fffffffffffff4b0);
                bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x1211a2);
                bitmap::BitmapArray::value_reference::operator_cast_to_long
                          ((value_reference *)0x1211bf);
              }
              else {
                bitmap::BitmapArray<long>::iterator::operator-
                          (&in_stack_fffffffffffff4b8->m_a,
                           (difference_type)in_stack_fffffffffffff4b0);
                bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x12114f);
                bitmap::BitmapArray::value_reference::operator_cast_to_long
                          ((value_reference *)0x12116c);
              }
              bitmap::BitmapArray<long>::iterator::operator+
                        (&in_stack_fffffffffffff4b8->m_a,(difference_type)in_stack_fffffffffffff4b0)
              ;
              bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x1211f7);
              bitmap::BitmapArray::value_reference::operator_cast_to_long
                        ((value_reference *)0x121214);
              bitmap::BitmapArray<long>::iterator::operator+
                        (&in_stack_fffffffffffff4b8->m_a,(difference_type)in_stack_fffffffffffff4b0)
              ;
              p1_04.pos_ = (pos_type)in_stack_fffffffffffff580;
              p1_04.array_ = in_stack_fffffffffffff578;
              p2_04.pos_ = in_stack_fffffffffffff570;
              p2_04.array_ = in_stack_fffffffffffff568;
              iVar4 = compare<char*,bitmap::BitmapArray<long>::iterator>
                                (in_stack_fffffffffffff560,p1_04,p2_04,in_stack_fffffffffffff558);
              bVar3 = iVar4 == 0;
            }
            if (bVar3) {
              bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x121290);
              bitmap::BitmapArray::value_reference::operator_cast_to_long
                        ((value_reference *)0x1212ad);
              bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x1212c3);
              bitmap::BitmapArray<long>::value_reference::operator=
                        (in_stack_fffffffffffff4b0,(long)in_stack_fffffffffffff4a8);
            }
          }
          bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x1212f4);
          lVar6 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                            ((value_reference *)0x121311);
          bVar3 = false;
          if (-1 < lVar6) {
            iVar11 = bitmap::BitmapArray<long>::iterator::operator-
                               (&in_stack_fffffffffffff4b8->m_a,
                                (difference_type)in_stack_fffffffffffff4b0);
            in_stack_fffffffffffff780 = (BitmapArray<long> *)iVar11.pos_;
            rVar12 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x121361);
            in_stack_fffffffffffff788 = rVar12.array_;
            in_stack_fffffffffffff790 = (BitmapArray<long> *)rVar12.pos_;
            lVar6 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                              ((value_reference *)0x12137e);
            if (lVar6 < 0) {
              local_8c8 = bitmap::BitmapArray<long>::iterator::operator-
                                    (&in_stack_fffffffffffff4b8->m_a,
                                     (difference_type)in_stack_fffffffffffff4b0);
              in_stack_fffffffffffff748 =
                   bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x12140a);
              bitmap::BitmapArray::value_reference::operator_cast_to_long
                        ((value_reference *)0x121427);
            }
            else {
              in_stack_fffffffffffff758 =
                   bitmap::BitmapArray<long>::iterator::operator-
                             (&in_stack_fffffffffffff4b8->m_a,
                              (difference_type)in_stack_fffffffffffff4b0);
              in_stack_fffffffffffff768 =
                   bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x1213b7);
              bitmap::BitmapArray::value_reference::operator_cast_to_long
                        ((value_reference *)0x1213d4);
            }
            iVar11 = bitmap::BitmapArray<long>::iterator::operator+
                               (&in_stack_fffffffffffff4b8->m_a,
                                (difference_type)in_stack_fffffffffffff4b0);
            in_stack_fffffffffffff798 = iVar11.array_;
            in_stack_fffffffffffff7a0 = iVar11.pos_;
            local_8e8 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x12145f);
            bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x12147c)
            ;
            local_8d8 = bitmap::BitmapArray<long>::iterator::operator+
                                  (&in_stack_fffffffffffff4b8->m_a,
                                   (difference_type)in_stack_fffffffffffff4b0);
            p1_05.pos_ = (pos_type)in_stack_fffffffffffff580;
            p1_05.array_ = in_stack_fffffffffffff578;
            p2_05.pos_ = in_stack_fffffffffffff570;
            p2_05.array_ = in_stack_fffffffffffff568;
            iVar4 = compare<char*,bitmap::BitmapArray<long>::iterator>
                              (in_stack_fffffffffffff560,p1_05,p2_05,in_stack_fffffffffffff558);
            bVar3 = iVar4 == 0;
          }
          if (bVar3) {
            local_8f8 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x1214ef);
            bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x12150c)
            ;
            local_908 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x121522);
            bitmap::BitmapArray<long>::value_reference::operator=
                      (in_stack_fffffffffffff4b0,(long)in_stack_fffffffffffff4a8);
          }
          if ((local_74 & 2) != 0) {
            local_918 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x121564);
            lVar6 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                              ((value_reference *)0x121581);
            in_stack_fffffffffffff4f7 = false;
            if (-1 < lVar6) {
              in_stack_fffffffffffff4e8 = local_38;
              local_948 = bitmap::BitmapArray<long>::iterator::operator-
                                    (&in_stack_fffffffffffff4b8->m_a,
                                     (difference_type)in_stack_fffffffffffff4b0);
              local_938 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x1215d1);
              lVar6 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                                ((value_reference *)0x1215ee);
              if (lVar6 < 0) {
                local_988 = bitmap::BitmapArray<long>::iterator::operator-
                                      (&in_stack_fffffffffffff4b8->m_a,
                                       (difference_type)in_stack_fffffffffffff4b0);
                local_978 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x12167a);
                uVar8 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                                  ((value_reference *)0x121697);
                in_stack_fffffffffffff4e0 = uVar8 ^ 0xffffffffffffffff;
              }
              else {
                local_968 = bitmap::BitmapArray<long>::iterator::operator-
                                      (&in_stack_fffffffffffff4b8->m_a,
                                       (difference_type)in_stack_fffffffffffff4b0);
                local_958 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x121627);
                in_stack_fffffffffffff4e0 =
                     bitmap::BitmapArray::value_reference::operator_cast_to_long
                               ((value_reference *)0x121644);
              }
              local_928 = bitmap::BitmapArray<long>::iterator::operator+
                                    (&in_stack_fffffffffffff4b8->m_a,
                                     (difference_type)in_stack_fffffffffffff4b0);
              local_9a8 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x1216cf);
              bitmap::BitmapArray::value_reference::operator_cast_to_long
                        ((value_reference *)0x1216ec);
              local_998 = bitmap::BitmapArray<long>::iterator::operator+
                                    (&in_stack_fffffffffffff4b8->m_a,
                                     (difference_type)in_stack_fffffffffffff4b0);
              p1_06.pos_ = (pos_type)in_stack_fffffffffffff580;
              p1_06.array_ = in_stack_fffffffffffff578;
              p2_06.pos_ = in_stack_fffffffffffff570;
              p2_06.array_ = in_stack_fffffffffffff568;
              iVar4 = compare<char*,bitmap::BitmapArray<long>::iterator>
                                (in_stack_fffffffffffff560,p1_06,p2_06,in_stack_fffffffffffff558);
              in_stack_fffffffffffff4f7 = iVar4 == 0;
            }
            if ((bool)in_stack_fffffffffffff4f7 != false) {
              local_9b8 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x12175f);
              uVar8 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                                ((value_reference *)0x12177c);
              in_stack_fffffffffffff4d8 = (BitmapArray<long> *)(uVar8 ^ 0xffffffffffffffff);
              local_9c8 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x121792);
              bitmap::BitmapArray<long>::value_reference::operator=
                        (in_stack_fffffffffffff4b0,(long)in_stack_fffffffffffff4a8);
            }
          }
          bVar3 = std::
                  stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                  ::empty((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                           *)0x1217c3);
          if (bVar3) {
            return;
          }
          pvVar7 = std::
                   stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                   ::top((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                          *)0x1217db);
          memcpy(&local_a00,pvVar7,0x38);
          bitmap::BitmapArray<long>::iterator::operator=(&local_28,&local_a00);
          bitmap::BitmapArray<long>::iterator::operator=((iterator *)&stack0x00000008,&iStack_9f0);
          bitmap::BitmapArray<long>::iterator::operator=((iterator *)&stack0x00000018,&iStack_9e0);
          local_74 = local_9d0;
          std::
          stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
          ::pop((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                 *)0x121852);
        }
        else {
          local_5f8 = bitmap::BitmapArray<long>::iterator::operator-
                                (&in_stack_fffffffffffff4b8->m_a,
                                 (difference_type)in_stack_fffffffffffff4b0);
          first1.pos_._0_7_ = in_stack_fffffffffffff4f0;
          first1.array_ = in_stack_fffffffffffff4e8;
          first1.pos_._7_1_ = in_stack_fffffffffffff4f7;
          last1.pos_ = in_stack_fffffffffffff4e0;
          last1.array_ = in_stack_fffffffffffff4d8;
          first2.pos_ = in_stack_fffffffffffff4d0;
          first2.array_ = in_stack_fffffffffffff4c8;
          helper::vecswap<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
                    (first1,last1,first2);
          it = bitmap::BitmapArray<long>::iterator::operator=
                         (&local_58,(iterator *)&stack0x00000008);
          bitmap::BitmapArray<long>::iterator::operator=(&local_48,it);
          local_78 = 0;
          local_628[0] = bitmap::BitmapArray<long>::iterator::operator+
                                   (&in_stack_fffffffffffff4b8->m_a,
                                    (difference_type)in_stack_fffffffffffff4b0);
          bVar3 = bitmap::BitmapArray<long>::iterator::operator<
                            (local_628,(iterator *)&stack0x00000018);
          if (bVar3) {
            local_648 = bitmap::BitmapArray<long>::iterator::operator+
                                  (&in_stack_fffffffffffff4b8->m_a,
                                   (difference_type)in_stack_fffffffffffff4b0);
            local_638 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x120bdd);
            lVar6 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                              ((value_reference *)0x120bfa);
            if (lVar6 < 0) {
              while( true ) {
                local_668 = bitmap::BitmapArray<long>::iterator::operator-
                                      (&in_stack_fffffffffffff4b8->m_a,
                                       (difference_type)in_stack_fffffffffffff4b0);
                local_658 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x120c35);
                lVar6 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                                  ((value_reference *)0x120c52);
                if (-1 < lVar6) break;
                bitmap::BitmapArray<long>::iterator::operator--(&local_48);
              }
              local_688 = bitmap::BitmapArray<long>::iterator::operator+
                                    (&in_stack_fffffffffffff4b8->m_a,
                                     (difference_type)in_stack_fffffffffffff4b0);
              local_678 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x120c9b);
              bitmap::BitmapArray::value_reference::operator_cast_to_long
                        ((value_reference *)0x120cb8);
              local_6a8 = bitmap::BitmapArray<long>::iterator::operator+
                                    (&in_stack_fffffffffffff4b8->m_a,
                                     (difference_type)in_stack_fffffffffffff4b0);
              local_698 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x120cf6);
              bitmap::BitmapArray<long>::value_reference::operator=
                        (in_stack_fffffffffffff4b0,(long)in_stack_fffffffffffff4a8);
            }
            bitmap::BitmapArray<long>::iterator::operator=(&local_58,(iterator *)&stack0x00000008);
            while( true ) {
              local_6b8 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x120d3d);
              lVar6 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                                ((value_reference *)0x120d5a);
              if (-1 < lVar6) break;
              bitmap::BitmapArray<long>::iterator::operator++(&local_58);
            }
            local_78 = 1;
          }
          dVar5 = bitmap::BitmapArray<long>::iterator::operator-(&local_48,&local_28);
          dVar10 = bitmap::BitmapArray<long>::iterator::operator-
                             ((iterator *)&stack0x00000018,&local_58);
          if (dVar10 < dVar5) {
            bVar3 = bitmap::BitmapArray<long>::iterator::operator==
                              (&local_48,(iterator *)&stack0x00000008);
            if ((bVar3) &&
               (bVar3 = bitmap::BitmapArray<long>::iterator::operator==
                                  ((iterator *)&stack0x00000008,&local_58), bVar3)) {
              local_78 = local_78 << 1;
            }
            pVar2 = local_28.pos_;
            pBVar1 = local_28.array_;
            iVar11 = bitmap::BitmapArray<long>::iterator::operator-
                               (&in_stack_fffffffffffff4b8->m_a,
                                (difference_type)in_stack_fffffffffffff4b0);
            a.pos_ = pVar2;
            a.array_ = pBVar1;
            c.pos_ = local_48.pos_;
            c.array_ = local_48.array_;
            in_stack_fffffffffffff4a8 = (value_type *)local_48.array_;
            in_stack_fffffffffffff4b0 = (value_reference *)local_48.pos_;
            helper::
            stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>
            ::stackinfo4(&local_758,a,iVar11,c,local_74 & 1 | local_78 & 2);
            std::
            stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
            ::push((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                    *)in_stack_fffffffffffff4b0,in_stack_fffffffffffff4a8);
            bitmap::BitmapArray<long>::iterator::operator=(&local_28,&local_58);
            bitmap::BitmapArray<long>::iterator::operator+=((iterator *)&stack0x00000008,local_60);
            local_74 = local_74 & 2 | local_78 & 1;
          }
          else {
            local_700 = local_58.array_;
            local_6f8 = local_58.pos_;
            local_710 = bitmap::BitmapArray<long>::iterator::operator+
                                  (&in_stack_fffffffffffff4b8->m_a,
                                   (difference_type)in_stack_fffffffffffff4b0);
            c_00.pos_ = (pos_type)in_stack_00000020;
            c_00.array_ = (BitmapArray<long> *)in_stack_00000018;
            a_00.pos_ = local_6f8;
            a_00.array_ = local_700;
            in_stack_fffffffffffff4a8 = in_stack_00000018;
            in_stack_fffffffffffff4b0 = in_stack_00000020;
            helper::
            stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>
            ::stackinfo4(&local_6f0,a_00,local_710,c_00,local_74 & 2 | local_78 & 1);
            std::
            stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
            ::push((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                    *)in_stack_fffffffffffff4b0,in_stack_fffffffffffff4a8);
            bitmap::BitmapArray<long>::iterator::operator-=((iterator *)&stack0x00000008,local_60);
            bitmap::BitmapArray<long>::iterator::operator=((iterator *)&stack0x00000018,&local_48);
            local_74 = local_74 & 1;
          }
        }
      }
      else {
        bVar3 = bitmap::BitmapArray<long>::iterator::operator<
                          (&local_28,(iterator *)&stack0x00000008);
        if (bVar3) {
          local_280 = local_18;
          local_278 = local_10;
          local_290 = local_28.array_;
          local_288 = local_28.pos_;
          iVar11.pos_ = (pos_type)in_stack_fffffffffffff788;
          iVar11.array_ = in_stack_fffffffffffff780;
          last_00.pos_ = (pos_type)in_stack_fffffffffffff798;
          last_00.array_ = in_stack_fffffffffffff790;
          in_stack_fffffffffffff4a8 = in_stack_00000008;
          in_stack_fffffffffffff4b0 = in_stack_00000010;
          in_stack_fffffffffffff4b8 = in_stack_00000018;
          in_stack_fffffffffffff4c8 = in_stack_00000038;
          merge_forward<char*,bitmap::BitmapArray<long>::iterator,long*>
                    ((char *)in_stack_fffffffffffff748.pos_,(iterator)in_stack_fffffffffffff768,
                     (long *)in_stack_fffffffffffff748.array_,in_stack_fffffffffffff758,iVar11,
                     last_00,in_stack_fffffffffffff7a0);
        }
        if ((local_74 & 1) != 0) {
          local_2c0 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11fff8);
          lVar6 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                            ((value_reference *)0x120015);
          bVar3 = false;
          if (-1 < lVar6) {
            local_2f0 = bitmap::BitmapArray<long>::iterator::operator-
                                  (&in_stack_fffffffffffff4b8->m_a,
                                   (difference_type)in_stack_fffffffffffff4b0);
            local_2e0 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x12006b);
            lVar6 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                              ((value_reference *)0x120088);
            if (lVar6 < 0) {
              local_330 = bitmap::BitmapArray<long>::iterator::operator-
                                    (&in_stack_fffffffffffff4b8->m_a,
                                     (difference_type)in_stack_fffffffffffff4b0);
              local_320 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x120117);
              bitmap::BitmapArray::value_reference::operator_cast_to_long
                        ((value_reference *)0x120134);
            }
            else {
              local_310 = bitmap::BitmapArray<long>::iterator::operator-
                                    (&in_stack_fffffffffffff4b8->m_a,
                                     (difference_type)in_stack_fffffffffffff4b0);
              local_300 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x1200c1);
              bitmap::BitmapArray::value_reference::operator_cast_to_long
                        ((value_reference *)0x1200de);
            }
            local_2d0 = bitmap::BitmapArray<long>::iterator::operator+
                                  (&in_stack_fffffffffffff4b8->m_a,
                                   (difference_type)in_stack_fffffffffffff4b0);
            local_350 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x120172);
            bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x12018f)
            ;
            local_340 = bitmap::BitmapArray<long>::iterator::operator+
                                  (&in_stack_fffffffffffff4b8->m_a,
                                   (difference_type)in_stack_fffffffffffff4b0);
            p1_01.pos_ = (pos_type)in_stack_fffffffffffff580;
            p1_01.array_ = in_stack_fffffffffffff578;
            p2_01.pos_ = in_stack_fffffffffffff570;
            p2_01.array_ = in_stack_fffffffffffff568;
            iVar4 = compare<char*,bitmap::BitmapArray<long>::iterator>
                              (in_stack_fffffffffffff560,p1_01,p2_01,in_stack_fffffffffffff558);
            bVar3 = iVar4 == 0;
          }
          if (bVar3) {
            local_360 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x12020b);
            bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x120228)
            ;
            local_370 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x120241);
            bitmap::BitmapArray<long>::value_reference::operator=
                      (in_stack_fffffffffffff4b0,(long)in_stack_fffffffffffff4a8);
          }
        }
        if ((local_74 & 2) != 0) {
          local_380 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x120288);
          lVar6 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                            ((value_reference *)0x1202a5);
          bVar3 = false;
          if (-1 < lVar6) {
            in_stack_fffffffffffff580 = local_38;
            local_3b0 = bitmap::BitmapArray<long>::iterator::operator-
                                  (&in_stack_fffffffffffff4b8->m_a,
                                   (difference_type)in_stack_fffffffffffff4b0);
            local_3a0 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x1202fb);
            lVar6 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                              ((value_reference *)0x120318);
            if (lVar6 < 0) {
              local_3f0 = bitmap::BitmapArray<long>::iterator::operator-
                                    (&in_stack_fffffffffffff4b8->m_a,
                                     (difference_type)in_stack_fffffffffffff4b0);
              local_3e0 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x1203a7);
              uVar8 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                                ((value_reference *)0x1203c4);
              in_stack_fffffffffffff578 = (BitmapArray<long> *)(uVar8 ^ 0xffffffffffffffff);
            }
            else {
              local_3d0 = bitmap::BitmapArray<long>::iterator::operator-
                                    (&in_stack_fffffffffffff4b8->m_a,
                                     (difference_type)in_stack_fffffffffffff4b0);
              local_3c0 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x120351);
              in_stack_fffffffffffff578 =
                   (BitmapArray<long> *)
                   bitmap::BitmapArray::value_reference::operator_cast_to_long
                             ((value_reference *)0x12036e);
            }
            local_390 = bitmap::BitmapArray<long>::iterator::operator+
                                  (&in_stack_fffffffffffff4b8->m_a,
                                   (difference_type)in_stack_fffffffffffff4b0);
            local_410 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x120402);
            bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x12041f)
            ;
            local_400 = bitmap::BitmapArray<long>::iterator::operator+
                                  (&in_stack_fffffffffffff4b8->m_a,
                                   (difference_type)in_stack_fffffffffffff4b0);
            p1_02.pos_ = (pos_type)in_stack_fffffffffffff580;
            p1_02.array_ = in_stack_fffffffffffff578;
            p2_02.pos_ = in_stack_fffffffffffff570;
            p2_02.array_ = in_stack_fffffffffffff568;
            iVar4 = compare<char*,bitmap::BitmapArray<long>::iterator>
                              (in_stack_fffffffffffff560,p1_02,p2_02,in_stack_fffffffffffff558);
            bVar3 = iVar4 == 0;
          }
          if (bVar3) {
            local_420 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x12049b);
            in_stack_fffffffffffff570 =
                 bitmap::BitmapArray::value_reference::operator_cast_to_long
                           ((value_reference *)0x1204b8);
            in_stack_fffffffffffff570 = in_stack_fffffffffffff570 ^ 0xffffffffffffffff;
            local_430 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x1204d1);
            bitmap::BitmapArray<long>::value_reference::operator=
                      (in_stack_fffffffffffff4b0,(long)in_stack_fffffffffffff4a8);
          }
        }
        bVar3 = std::
                stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                ::empty((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                         *)0x120505);
        if (bVar3) {
          return;
        }
        pvVar7 = std::
                 stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                 ::top((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                        *)0x12051d);
        memcpy(&local_468,pvVar7,0x38);
        bitmap::BitmapArray<long>::iterator::operator=(&local_28,&local_468);
        bitmap::BitmapArray<long>::iterator::operator=((iterator *)&stack0x00000008,&iStack_458);
        bitmap::BitmapArray<long>::iterator::operator=((iterator *)&stack0x00000018,&iStack_448);
        local_74 = local_438;
        std::
        stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
        ::pop((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
               *)0x120594);
      }
    }
    bVar3 = bitmap::BitmapArray<long>::iterator::operator<(&local_28,(iterator *)&stack0x00000008);
    if ((bVar3) &&
       (bVar3 = bitmap::BitmapArray<long>::iterator::operator<
                          ((iterator *)&stack0x00000008,(iterator *)&stack0x00000018), bVar3)) {
      local_88 = local_18;
      local_80 = local_10;
      local_98 = local_28.array_;
      local_90 = local_28.pos_;
      middle_00.pos_ = (pos_type)in_stack_fffffffffffffa58;
      middle_00.array_ = in_stack_fffffffffffffa50;
      last_01.pos_ = (pos_type)in_stack_fffffffffffffa68;
      last_01.array_ = in_stack_fffffffffffffa60;
      in_stack_fffffffffffff4a8 = in_stack_00000008;
      in_stack_fffffffffffff4b0 = in_stack_00000010;
      in_stack_fffffffffffff4b8 = in_stack_00000018;
      in_stack_fffffffffffff4c8 = in_stack_00000038;
      merge_backward<char*,bitmap::BitmapArray<long>::iterator,long*>
                ((char *)in_stack_fffffffffffffa18.pos_,in_stack_fffffffffffffa38,
                 (long *)in_stack_fffffffffffffa18.array_,in_stack_fffffffffffffa28,middle_00,
                 last_01,in_stack_fffffffffffffa70);
    }
    if ((local_74 & 1) != 0) {
      local_c8 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11f905);
      lVar6 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                        ((value_reference *)0x11f922);
      bVar3 = false;
      if (-1 < lVar6) {
        local_f8 = bitmap::BitmapArray<long>::iterator::operator-
                             (&in_stack_fffffffffffff4b8->m_a,
                              (difference_type)in_stack_fffffffffffff4b0);
        local_e8 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11f978);
        lVar6 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                          ((value_reference *)0x11f995);
        if (lVar6 < 0) {
          local_138 = bitmap::BitmapArray<long>::iterator::operator-
                                (&in_stack_fffffffffffff4b8->m_a,
                                 (difference_type)in_stack_fffffffffffff4b0);
          local_128 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11fa24);
          bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x11fa41);
        }
        else {
          local_118 = bitmap::BitmapArray<long>::iterator::operator-
                                (&in_stack_fffffffffffff4b8->m_a,
                                 (difference_type)in_stack_fffffffffffff4b0);
          local_108 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11f9ce);
          bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x11f9eb);
        }
        local_d8 = bitmap::BitmapArray<long>::iterator::operator+
                             (&in_stack_fffffffffffff4b8->m_a,
                              (difference_type)in_stack_fffffffffffff4b0);
        local_158 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11fa7f);
        bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x11fa9c);
        local_148 = bitmap::BitmapArray<long>::iterator::operator+
                              (&in_stack_fffffffffffff4b8->m_a,
                               (difference_type)in_stack_fffffffffffff4b0);
        p1.pos_ = (pos_type)in_stack_fffffffffffff580;
        p1.array_ = in_stack_fffffffffffff578;
        p2.pos_ = in_stack_fffffffffffff570;
        p2.array_ = in_stack_fffffffffffff568;
        iVar4 = compare<char*,bitmap::BitmapArray<long>::iterator>
                          (in_stack_fffffffffffff560,p1,p2,in_stack_fffffffffffff558);
        bVar3 = iVar4 == 0;
      }
      if (bVar3) {
        local_168 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11fb18);
        bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x11fb35);
        local_178 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11fb4e);
        bitmap::BitmapArray<long>::value_reference::operator=
                  (in_stack_fffffffffffff4b0,(long)in_stack_fffffffffffff4a8);
      }
    }
    if ((local_74 & 2) != 0) {
      local_188 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11fb95);
      lVar6 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                        ((value_reference *)0x11fbb2);
      bVar3 = false;
      if (-1 < lVar6) {
        local_1b8 = bitmap::BitmapArray<long>::iterator::operator-
                              (&in_stack_fffffffffffff4b8->m_a,
                               (difference_type)in_stack_fffffffffffff4b0);
        local_1a8 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11fc08);
        lVar6 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                          ((value_reference *)0x11fc25);
        if (lVar6 < 0) {
          local_1f8 = bitmap::BitmapArray<long>::iterator::operator-
                                (&in_stack_fffffffffffff4b8->m_a,
                                 (difference_type)in_stack_fffffffffffff4b0);
          local_1e8 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11fcb4);
          bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x11fcd1);
        }
        else {
          local_1d8 = bitmap::BitmapArray<long>::iterator::operator-
                                (&in_stack_fffffffffffff4b8->m_a,
                                 (difference_type)in_stack_fffffffffffff4b0);
          local_1c8 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11fc5e);
          bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x11fc7b);
        }
        local_198 = bitmap::BitmapArray<long>::iterator::operator+
                              (&in_stack_fffffffffffff4b8->m_a,
                               (difference_type)in_stack_fffffffffffff4b0);
        local_218 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11fd0f);
        bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x11fd2c);
        local_208 = bitmap::BitmapArray<long>::iterator::operator+
                              (&in_stack_fffffffffffff4b8->m_a,
                               (difference_type)in_stack_fffffffffffff4b0);
        p1_00.pos_ = (pos_type)in_stack_fffffffffffff580;
        p1_00.array_ = in_stack_fffffffffffff578;
        p2_00.pos_ = in_stack_fffffffffffff570;
        p2_00.array_ = in_stack_fffffffffffff568;
        iVar4 = compare<char*,bitmap::BitmapArray<long>::iterator>
                          (in_stack_fffffffffffff560,p1_00,p2_00,in_stack_fffffffffffff558);
        bVar3 = iVar4 == 0;
      }
      if (bVar3) {
        local_228 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11fda8);
        bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x11fdc5);
        local_238 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11fdde);
        bitmap::BitmapArray<long>::value_reference::operator=
                  (in_stack_fffffffffffff4b0,(long)in_stack_fffffffffffff4a8);
      }
    }
    bVar3 = std::
            stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
            ::empty((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                     *)0x11fe12);
    if (bVar3) break;
    pvVar7 = std::
             stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
             ::top((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                    *)0x11fe2a);
    memcpy(&local_270,pvVar7,0x38);
    bitmap::BitmapArray<long>::iterator::operator=(&local_28,&local_270);
    bitmap::BitmapArray<long>::iterator::operator=((iterator *)&stack0x00000008,&iStack_260);
    bitmap::BitmapArray<long>::iterator::operator=((iterator *)&stack0x00000018,&iStack_250);
    local_74 = local_240;
    std::
    stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
    ::pop((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
           *)0x11fea1);
  }
  return;
}

Assistant:

void merge(stack_type &stack, const StringIterator_type T,
           const SAIterator_type PA, SAIterator_type first,
           SAIterator_type middle, SAIterator_type last, BufIterator_type buf,
           typename std::iterator_traits<SAIterator_type>::value_type bufsize,
           typename std::iterator_traits<SAIterator_type>::value_type depth) {
  typedef typename std::iterator_traits<SAIterator_type>::difference_type difference_type;
  typedef typename stack_type::value_type stackinfo_type;
#define GETIDX(a) ((0 <= (a)) ? (a) : (~(a)))
#define MERGE_CHECK(a)\
  {\
    if((0 <= *(a)) &&\
       (compare(T, PA + GETIDX(*((a) - 1)), PA + *(a), depth) == 0)) {\
      *(a) = ~*(a);\
    }\
  }

  SAIterator_type i, j;
  difference_type m, len, half;
  int check, next;

  for (check = 0;;) {

    if ((last - middle) <= bufsize) {
      if ((first < middle) && (middle < last)) {
        merge_backward(T, PA, buf, first, middle, last, depth);
      }
      if (check & 1) {
        MERGE_CHECK(first);
      }
      if (check & 2) {
        MERGE_CHECK(last);
      }
      STACK_POP4(first, middle, last, check);
      continue;
    }

    if ((middle - first) <= bufsize) {
      if (first < middle) {
        merge_forward(T, PA, buf, first, middle, last, depth);
      }
      if (check & 1) {
        MERGE_CHECK(first);
      }
      if (check & 2) {
        MERGE_CHECK(last);
      }
      STACK_POP4(first, middle, last, check);
      continue;
    }

    for (m = 0, len = std::min(middle - first, last - middle), half = len >> 1;
        0 < len; len = half, half >>= 1) {
      if (compare(T, PA + GETIDX(*(middle + m + half)),
                  PA + GETIDX(*(middle - m - half - 1)), depth) < 0) {
        m += half + 1;
        half -= ((len & 1) == 0);
      }
    }

    if (0 < m) {
      helper::vecswap(middle - m, middle, middle);
      i = j = middle, next = 0;
      if ((middle + m) < last) {
        if (*(middle + m) < 0) {
          for (; *(i - 1) < 0; --i) {
          }
          *(middle + m) = ~*(middle + m);
        }
        for (j = middle; *j < 0; ++j) {
        }
        next = 1;
      }
      if ((i - first) <= (last - j)) {
        STACK_PUSH4(j, middle + m, last, (check & 2) | (next & 1));
        middle -= m, last = i, check = (check & 1);
      } else {
        if ((i == middle) && (middle == j)) {
          next <<= 1;
        }
        STACK_PUSH4(first, middle - m, i, (check & 1) | (next & 2));
        first = j, middle += m, check = (check & 2) | (next & 1);
      }
    } else {
      if (check & 1) {
        MERGE_CHECK(first);
      }
      MERGE_CHECK(middle);
      if (check & 2) {
        MERGE_CHECK(last);
      }
      STACK_POP4(first, middle, last, check);
    }
  }
#undef GETIDX
#undef MERGE_CHECK
}